

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *this,
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *other)

{
  TypedID<(spirv_cross::Types)3> *pTVar1;
  TypedID<(spirv_cross::Types)3> *pTVar2;
  ulong local_20;
  size_t i;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *other_local;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *this_local;
  
  clear(this);
  pTVar1 = (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr;
  pTVar2 = AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::data
                     (&other->stack_storage);
  if (pTVar1 == pTVar2) {
    reserve(this,(other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size
           );
    for (local_20 = 0;
        local_20 <
        (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size;
        local_20 = local_20 + 1) {
      (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr[local_20].id =
           (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr[local_20].id;
    }
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size =
         (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size;
    (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size = 0;
  }
  else {
    pTVar1 = (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr;
    pTVar2 = AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::data
                       (&this->stack_storage);
    if (pTVar1 != pTVar2) {
      free((this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr);
    }
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr =
         (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr;
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size =
         (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size;
    this->buffer_capacity = other->buffer_capacity;
    (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr =
         (TypedID<(spirv_cross::Types)3> *)0x0;
    (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}